

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::internal::CmpHelperEQ<test::Point,test::Point>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,Point *expected,Point *actual)

{
  undefined4 in_EAX;
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  string local_60;
  string local_40;
  
  iVar2 = -(uint)((int)*(undefined8 *)actual_str == (*expected).x);
  iVar3 = -(uint)((int)((ulong)*(undefined8 *)actual_str >> 0x20) == (*expected).y);
  auVar1._4_4_ = iVar2;
  auVar1._0_4_ = iVar2;
  auVar1._8_4_ = iVar3;
  auVar1._12_4_ = iVar3;
  iVar2 = movmskpd(in_EAX,auVar1);
  if (iVar2 == 3) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    PrintToString<test::Point>(&local_40,(Point *)actual_str);
    PrintToString<test::Point>(&local_60,expected);
    EqFailure(__return_storage_ptr__,(char *)this,expected_str,&local_40,&local_60,false);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }